

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z_libpd.c
# Opt level: O2

int libpd_process_short(int ticks,short *inBuffer,short *outBuffer)

{
  short sVar1;
  _instancestuff *p_Var2;
  float *pfVar3;
  t_sample *ptVar4;
  int iVar5;
  int iVar6;
  float *pfVar7;
  int iVar8;
  t_sample *ptVar9;
  int iVar10;
  
  sys_lock();
  sys_pollgui();
  iVar10 = 0;
  if (ticks < 1) {
    ticks = 0;
  }
  for (; p_Var2 = pd_maininstance.pd_stuff, iVar10 != ticks; iVar10 = iVar10 + 1) {
    ptVar4 = (pd_maininstance.pd_stuff)->st_soundin;
    iVar6 = 0;
    iVar5 = (pd_maininstance.pd_stuff)->st_inchannels;
    if ((pd_maininstance.pd_stuff)->st_inchannels < 1) {
      iVar5 = iVar6;
    }
    for (; ptVar9 = ptVar4, iVar8 = iVar5, iVar6 != 0x40; iVar6 = iVar6 + 1) {
      while (iVar8 != 0) {
        sVar1 = *inBuffer;
        inBuffer = inBuffer + 1;
        *ptVar9 = (float)(int)sVar1 * 3.051851e-05;
        ptVar9 = ptVar9 + 0x40;
        iVar8 = iVar8 + -1;
      }
      ptVar4 = ptVar4 + 1;
    }
    iVar6 = 0;
    memset(p_Var2->st_soundout,0,(long)p_Var2->st_outchannels << 8);
    sched_tick();
    pfVar3 = (pd_maininstance.pd_stuff)->st_soundout;
    iVar5 = (pd_maininstance.pd_stuff)->st_outchannels;
    if ((pd_maininstance.pd_stuff)->st_outchannels < 1) {
      iVar5 = iVar6;
    }
    for (; pfVar7 = pfVar3, iVar8 = iVar5, iVar6 != 0x40; iVar6 = iVar6 + 1) {
      while (iVar8 != 0) {
        *outBuffer = (short)(int)(*pfVar7 * 32767.0);
        outBuffer = outBuffer + 1;
        pfVar7 = pfVar7 + 0x40;
        iVar8 = iVar8 + -1;
      }
      pfVar3 = pfVar3 + 1;
    }
  }
  sys_unlock();
  return 0;
}

Assistant:

int libpd_process_short(const int ticks, const short *inBuffer, short *outBuffer) {
  PROCESS(* short_to_sample, * sample_to_short)
}